

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall
tcu::TextureLevelPyramid::TextureLevelPyramid
          (TextureLevelPyramid *this,TextureFormat *format,int numLevels)

{
  size_type __n;
  allocator<tcu::PixelBufferAccess> local_2d [16];
  allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_> local_1d;
  int local_1c;
  TextureFormat *pTStack_18;
  int numLevels_local;
  TextureFormat *format_local;
  TextureLevelPyramid *this_local;
  
  this->m_format = *format;
  local_1c = numLevels;
  pTStack_18 = format;
  format_local = &this->m_format;
  std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>::allocator(&local_1d);
  std::
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ::vector(&this->m_data,(long)numLevels,&local_1d);
  std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>::~allocator(&local_1d);
  __n = (size_type)local_1c;
  std::allocator<tcu::PixelBufferAccess>::allocator(local_2d);
  std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::vector
            (&this->m_access,__n,local_2d);
  std::allocator<tcu::PixelBufferAccess>::~allocator(local_2d);
  return;
}

Assistant:

TextureLevelPyramid::TextureLevelPyramid (const TextureFormat& format, int numLevels)
	: m_format	(format)
	, m_data	(numLevels)
	, m_access	(numLevels)
{
}